

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O0

SUNErrCode SUNAdaptController_UpdateH(SUNAdaptController C,sunrealtype h,sunrealtype dsm)

{
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  SUNContext sunctx_local_scope_;
  SUNErrCode ier;
  undefined4 local_24;
  undefined4 local_4;
  
  local_24 = 0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    if (*(long *)(*(long *)(in_RDI + 8) + 0x40) != 0) {
      local_24 = (**(code **)(*(long *)(in_RDI + 8) + 0x40))(in_XMM0_Qa,in_XMM1_Qa,in_RDI);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdaptController_UpdateH(SUNAdaptController C, sunrealtype h,
                                      sunrealtype dsm)
{
  SUNErrCode ier = SUN_SUCCESS;
  if (C == NULL) { return SUN_ERR_ARG_CORRUPT; }
  SUNFunctionBegin(C->sunctx);
  SUNAssert(isfinite(h), SUN_ERR_ARG_OUTOFRANGE);
  SUNAssert(dsm >= SUN_RCONST(0.0), SUN_ERR_ARG_OUTOFRANGE);
  if (C->ops->updateh) { ier = C->ops->updateh(C, h, dsm); }
  return (ier);
}